

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O3

shared_ptr<gui::PanelStyle> __thiscall gui::Panel::getStyle(Panel *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar2;
  PanelStyle *pPVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long in_RSI;
  shared_ptr<gui::PanelStyle> sVar5;
  undefined1 local_29;
  PanelStyle *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  if (*(char *)(in_RSI + 0x210) == '\0') {
    local_28 = (PanelStyle *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<gui::PanelStyle,std::allocator<gui::PanelStyle>,gui::PanelStyle_const&>
              (&_Stack_20,&local_28,(allocator<gui::PanelStyle> *)&local_29,
               *(PanelStyle **)(in_RSI + 0x200));
    _Var4._M_pi = _Stack_20._M_pi;
    pPVar3 = local_28;
    local_28 = (PanelStyle *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x208);
    *(PanelStyle **)(in_RSI + 0x200) = pPVar3;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x208) = _Var4._M_pi;
    in_RDX._M_pi = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX_00;
      if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
        in_RDX._M_pi = extraout_RDX_01;
      }
    }
    *(undefined1 *)(in_RSI + 0x210) = 1;
  }
  (this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase =
       *(_func_int ***)(in_RSI + 0x200);
  psVar2 = *(pointer *)(in_RSI + 0x208);
  (this->super_Group).super_Container.super_ContainerBase.children_.
  super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>.
  _M_impl.super__Vector_impl_data._M_start = psVar2;
  if (psVar2 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(psVar2->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &(psVar2->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
  sVar5.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::PanelStyle>)
         sVar5.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PanelStyle> Panel::getStyle() {
    if (!styleCopied_) {
        style_ = style_->clone();
        styleCopied_ = true;
    }
    return style_;
}